

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix.h
# Opt level: O0

MutSuffix __thiscall
mp::BasicSuffixSet<std::allocator<char>_>::Find
          (BasicSuffixSet<std::allocator<char>_> *this,StringRef name)

{
  StringRef name_00;
  bool bVar1;
  iterator this_00;
  set<mp::internal::SuffixBase::Impl,_mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess,_std::allocator<mp::internal::SuffixBase::Impl>_>
  *in_RDI;
  iterator i;
  set<mp::internal::SuffixBase::Impl,_mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess,_std::allocator<mp::internal::SuffixBase::Impl>_>
  *in_stack_ffffffffffffff28;
  reference impl;
  key_type *in_stack_ffffffffffffff30;
  _Rb_tree_header *p_Var2;
  _Self local_b0 [3];
  string local_98 [112];
  _Self local_28 [4];
  Suffix local_8;
  
  p_Var2 = &(in_RDI->_M_t)._M_impl.super__Rb_tree_header;
  std::__cxx11::string::string(local_98);
  name_00.size_ = (size_t)p_Var2;
  name_00.data_ = (char *)in_RDI;
  internal::SuffixBase::Impl::Impl
            (in_stack_ffffffffffffff30,name_00,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             (int)in_stack_ffffffffffffff28,(SuffixTable *)0x15c080);
  this_00 = std::
            set<mp::internal::SuffixBase::Impl,_mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess,_std::allocator<mp::internal::SuffixBase::Impl>_>
            ::find(in_RDI,in_stack_ffffffffffffff30);
  local_28[0]._M_node = this_00._M_node;
  internal::SuffixBase::Impl::~Impl((Impl *)0x15c0af);
  std::__cxx11::string::~string(local_98);
  local_b0[0]._M_node =
       (_Base_ptr)
       std::
       set<mp::internal::SuffixBase::Impl,_mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess,_std::allocator<mp::internal::SuffixBase::Impl>_>
       ::end(in_stack_ffffffffffffff28);
  bVar1 = std::operator!=(local_28,local_b0);
  if (bVar1) {
    impl = std::_Rb_tree_const_iterator<mp::internal::SuffixBase::Impl>::operator*
                     ((_Rb_tree_const_iterator<mp::internal::SuffixBase::Impl> *)0x15c0f1);
  }
  else {
    impl = (Impl *)0x0;
  }
  MutSuffix::MutSuffix((MutSuffix *)this_00._M_node,impl);
  return (MutSuffix)local_8.super_SuffixBase.impl_;
}

Assistant:

MutSuffix Find(fmt::StringRef name) {
    typename Set::iterator i = set_.find(SuffixImpl(name));
    return MutSuffix(i != set_.end() ? &*i : 0);
  }